

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef::~IfcAsymmetricIShapeProfileDef
          (IfcAsymmetricIShapeProfileDef *this)

{
  IfcProfileDef::~IfcProfileDef((IfcProfileDef *)this,&PTR_construction_vtable_24__007ae850);
  return;
}

Assistant:

IfcAsymmetricIShapeProfileDef() : Object("IfcAsymmetricIShapeProfileDef") {}